

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

bool __thiscall
lan::db::init_iter<int>(db *this,db_bit *context,string *name,int value,db_bit_type type)

{
  bool bVar1;
  string *context_00;
  db_bit *pdVar2;
  bool local_c9;
  string local_88;
  byte local_61;
  string local_60;
  db_bit_type local_30;
  int local_2c;
  db_bit_type type_local;
  int value_local;
  string *name_local;
  db_bit *context_local;
  db *this_local;
  
  this->data = context;
  local_30 = type;
  local_2c = value;
  _type_local = name;
  name_local = &context->key;
  context_local = (db_bit *)this;
  pdVar2 = (db_bit *)operator_new(0x50);
  db_bit::db_bit(pdVar2);
  context_00 = name_local;
  this->data->lin = pdVar2;
  this->data = this->data->lin;
  local_61 = 0;
  bVar1 = 8 < (int)local_30;
  if (bVar1) {
    pdVar2 = this->data;
    std::__cxx11::string::string((string *)&local_88,(string *)name);
    local_c9 = set_bit(this,(db_bit *)context_00,pdVar2,&local_88,local_30);
  }
  else {
    pdVar2 = this->data;
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    local_61 = 1;
    local_c9 = set_bit<int>(this,(db_bit *)context_00,pdVar2,&local_60,local_30,local_2c);
  }
  this_local._7_1_ = local_c9;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool init_iter(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            data->lin = new db_bit; data = data->lin;
            return ((type < lan::Array) ? set_bit(context, data, name, type, value) : set_bit(context, data, name, type));
        }